

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::GLSL420Pack::LineContinuationTest::prepareNextTestCase
          (LineContinuationTest *this,GLuint test_case_index)

{
  ostringstream *this_00;
  GLuint GVar1;
  GLchar *__s;
  size_t sVar2;
  char *pcVar3;
  ostringstream *this_01;
  bool bVar4;
  undefined1 local_190 [120];
  ios_base local_118 [264];
  
  if (test_case_index == 0xffffffff) {
    (this->m_test_case).m_case = 0xf;
  }
  else {
    if (0x3b < test_case_index) {
      return false;
    }
    (this->m_test_case).m_line_endings =
         prepareNextTestCase::test_cases[test_case_index].m_line_endings;
    GVar1 = prepareNextTestCase::test_cases[test_case_index].m_repetitions;
    (this->m_test_case).m_case = prepareNextTestCase::test_cases[test_case_index].m_case;
    (this->m_test_case).m_repetitions = GVar1;
  }
  local_190._0_8_ = *(undefined8 *)(**(long **)&this->field_0x70 + 0x10);
  this_00 = (ostringstream *)(local_190 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Test case: ",0xb);
  bVar4 = (this->m_test_case).m_repetitions != 0;
  pcVar3 = "multiple";
  if (!bVar4) {
    pcVar3 = "single";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar3,(ulong)bVar4 * 2 + 6)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00," line continuation, with ",0x19);
  bVar4 = (this->m_test_case).m_line_endings == 0;
  pcVar3 = "dos";
  if (bVar4) {
    pcVar3 = "unix";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar3,(ulong)bVar4 + 3);
  this_01 = this_00;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00," line endings, is placed ",0x19);
  __s = casesToStr((LineContinuationTest *)this_01,(this->m_test_case).m_case);
  sVar2 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,__s,sVar2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_118);
  return true;
}

Assistant:

bool LineContinuationTest::prepareNextTestCase(glw::GLuint test_case_index)
{
	static const testCase test_cases[] = { { ASSIGNMENT_BEFORE_OPERATOR, ONCE, UNIX },
										   { ASSIGNMENT_BEFORE_OPERATOR, ONCE, DOS },
										   { ASSIGNMENT_BEFORE_OPERATOR, MULTIPLE_TIMES, UNIX },
										   { ASSIGNMENT_BEFORE_OPERATOR, MULTIPLE_TIMES, DOS },
										   { ASSIGNMENT_AFTER_OPERATOR, ONCE, UNIX },
										   { ASSIGNMENT_AFTER_OPERATOR, ONCE, DOS },
										   { ASSIGNMENT_AFTER_OPERATOR, MULTIPLE_TIMES, UNIX },
										   { ASSIGNMENT_AFTER_OPERATOR, MULTIPLE_TIMES, DOS },
										   { VECTOR_VARIABLE_INITIALIZER, ONCE, UNIX },
										   { VECTOR_VARIABLE_INITIALIZER, ONCE, DOS },
										   { VECTOR_VARIABLE_INITIALIZER, MULTIPLE_TIMES, UNIX },
										   { VECTOR_VARIABLE_INITIALIZER, MULTIPLE_TIMES, DOS },
										   { TOKEN_INSIDE_FUNCTION_NAME, ONCE, UNIX },
										   { TOKEN_INSIDE_FUNCTION_NAME, ONCE, DOS },
										   { TOKEN_INSIDE_FUNCTION_NAME, MULTIPLE_TIMES, UNIX },
										   { TOKEN_INSIDE_FUNCTION_NAME, MULTIPLE_TIMES, DOS },
										   { TOKEN_INSIDE_TYPE_NAME, ONCE, UNIX },
										   { TOKEN_INSIDE_TYPE_NAME, ONCE, DOS },
										   { TOKEN_INSIDE_TYPE_NAME, MULTIPLE_TIMES, UNIX },
										   { TOKEN_INSIDE_TYPE_NAME, MULTIPLE_TIMES, DOS },
										   { TOKEN_INSIDE_VARIABLE_NAME, ONCE, UNIX },
										   { TOKEN_INSIDE_VARIABLE_NAME, ONCE, DOS },
										   { TOKEN_INSIDE_VARIABLE_NAME, MULTIPLE_TIMES, UNIX },
										   { TOKEN_INSIDE_VARIABLE_NAME, MULTIPLE_TIMES, DOS },
										   { PREPROCESSOR_TOKEN_INSIDE, ONCE, UNIX },
										   { PREPROCESSOR_TOKEN_INSIDE, ONCE, DOS },
										   { PREPROCESSOR_TOKEN_INSIDE, MULTIPLE_TIMES, UNIX },
										   { PREPROCESSOR_TOKEN_INSIDE, MULTIPLE_TIMES, DOS },
										   { PREPROCESSOR_TOKEN_BETWEEN, ONCE, UNIX },
										   { PREPROCESSOR_TOKEN_BETWEEN, ONCE, DOS },
										   { PREPROCESSOR_TOKEN_BETWEEN, MULTIPLE_TIMES, UNIX },
										   { PREPROCESSOR_TOKEN_BETWEEN, MULTIPLE_TIMES, DOS },
										   { COMMENT, ONCE, UNIX },
										   { COMMENT, ONCE, DOS },
										   { COMMENT, MULTIPLE_TIMES, UNIX },
										   { COMMENT, MULTIPLE_TIMES, DOS },
										   { SOURCE_TERMINATION_NULL, ONCE, UNIX },
										   { SOURCE_TERMINATION_NULL, ONCE, DOS },
										   { SOURCE_TERMINATION_NULL, MULTIPLE_TIMES, UNIX },
										   { SOURCE_TERMINATION_NULL, MULTIPLE_TIMES, DOS },
										   { SOURCE_TERMINATION_NON_NULL, ONCE, UNIX },
										   { SOURCE_TERMINATION_NON_NULL, ONCE, DOS },
										   { SOURCE_TERMINATION_NON_NULL, MULTIPLE_TIMES, UNIX },
										   { SOURCE_TERMINATION_NON_NULL, MULTIPLE_TIMES, DOS },
										   { PART_TERMINATION_NULL, ONCE, UNIX },
										   { PART_TERMINATION_NULL, ONCE, DOS },
										   { PART_TERMINATION_NULL, MULTIPLE_TIMES, UNIX },
										   { PART_TERMINATION_NULL, MULTIPLE_TIMES, DOS },
										   { PART_NEXT_TO_TERMINATION_NULL, ONCE, UNIX },
										   { PART_NEXT_TO_TERMINATION_NULL, ONCE, DOS },
										   { PART_NEXT_TO_TERMINATION_NULL, MULTIPLE_TIMES, UNIX },
										   { PART_NEXT_TO_TERMINATION_NULL, MULTIPLE_TIMES, DOS },
										   { PART_TERMINATION_NON_NULL, ONCE, UNIX },
										   { PART_TERMINATION_NON_NULL, ONCE, DOS },
										   { PART_TERMINATION_NON_NULL, MULTIPLE_TIMES, UNIX },
										   { PART_TERMINATION_NON_NULL, MULTIPLE_TIMES, DOS },
										   { PART_NEXT_TO_TERMINATION_NON_NULL, ONCE, UNIX },
										   { PART_NEXT_TO_TERMINATION_NON_NULL, ONCE, DOS },
										   { PART_NEXT_TO_TERMINATION_NON_NULL, MULTIPLE_TIMES, UNIX },
										   { PART_NEXT_TO_TERMINATION_NON_NULL, MULTIPLE_TIMES, DOS } };

	static const GLuint max_test_cases = sizeof(test_cases) / sizeof(testCase);

	if ((GLuint)-1 == test_case_index)
	{
		m_test_case.m_case = DEBUG_CASE;
	}
	else if (max_test_cases <= test_case_index)
	{
		return false;
	}
	else
	{
		m_test_case = test_cases[test_case_index];
	}

	m_context.getTestContext().getLog() << tcu::TestLog::Message
										<< "Test case: " << repetitionsToStr((REPETITIONS)m_test_case.m_repetitions)
										<< " line continuation, with "
										<< lineEndingsToStr((LINE_ENDINGS)m_test_case.m_line_endings)
										<< " line endings, is placed " << casesToStr((CASES)m_test_case.m_case)
										<< tcu::TestLog::EndMessage;

	return true;
}